

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void print_image<cert::OutputImage<cert::Color,120ul,120ul>>
               (ofstream *ppm,OutputImage<cert::Color,_120UL,_120UL> *frame)

{
  byte bVar1;
  ushort uVar2;
  ostream *poVar3;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0xa8c0; lVar4 = lVar4 + 3) {
    uVar2 = *(ushort *)(&(frame->data)._M_elems[0].r + lVar4);
    bVar1 = (&(frame->data)._M_elems[0].b)[lVar4];
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)ppm,CONCAT12(bVar1,uVar2) & 0xff);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(uVar2 >> 8));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bVar1);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void print_image (std::ofstream& ppm, T const& frame)
{
	for (int i = 0; i < frame.size (); i++)
	{
		int r = static_cast<int> (frame.at (i).r);
		int g = static_cast<int> (frame.at (i).g);
		int b = static_cast<int> (frame.at (i).b);

		ppm << r << " " << g << " " << b << "\n";
	}
}